

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O0

void helics::BrokerFactory::addExtraTypes(string *name,CoreType type)

{
  undefined4 in_ESI;
  string *in_stack_00000018;
  SearchableObjectHolder<helics::Core,_helics::CoreType> *in_stack_00000020;
  
  switch(in_ESI) {
  case 3:
    gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::addType
              (in_stack_00000020,in_stack_00000018,name._4_4_);
    break;
  case 4:
    gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::addType
              (in_stack_00000020,in_stack_00000018,name._4_4_);
    break;
  case 5:
    gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::addType
              (in_stack_00000020,in_stack_00000018,name._4_4_);
    break;
  default:
    break;
  case 0x12:
    gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::addType
              (in_stack_00000020,in_stack_00000018,name._4_4_);
  }
  return;
}

Assistant:

static void addExtraTypes(const std::string& name, CoreType type)
{
    switch (type) {
        case CoreType::INPROC:
            searchableBrokers.addType(name, CoreType::TEST);
            break;
        case CoreType::TEST:
            searchableBrokers.addType(name, CoreType::INPROC);
            break;
        case CoreType::IPC:
            searchableBrokers.addType(name, CoreType::INTERPROCESS);
            break;
        case CoreType::INTERPROCESS:
            searchableBrokers.addType(name, CoreType::IPC);
            break;
        default:
            break;
    }
}